

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O2

void __thiscall pstack::Procman::Process::processAUXV(Process *this,Reader *auxio)

{
  uint64_t uVar1;
  Addr load;
  Context *__args_1;
  element_type *peVar2;
  Process *pPVar3;
  value_type *pvVar4;
  ostream *poVar5;
  char *pcVar6;
  _func_int **pp_Var7;
  string_view name;
  ReaderArray<Elf64_auxv_t,_64UL> local_4c8;
  string local_a0 [8];
  string exeName;
  undefined1 local_70 [8];
  shared_ptr<pstack::Elf::Object> elf;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  allocator<char> local_39;
  Process *local_38;
  
  pp_Var7 = (_func_int **)0x0;
  ReaderArray<Elf64_auxv_t,_64UL>::ReaderArray(&local_4c8,auxio,0);
  elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_4c8;
  local_38 = this;
  exeName.field_2._8_8_ = &this->vdsoImage;
  do {
    if (pp_Var7 ==
        elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]
        ._vptr__Sp_counted_base) {
      return;
    }
    pvVar4 = ReaderArray<Elf64_auxv_t,_64UL>::iterator::operator*
                       ((iterator *)
                        &elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    uVar1 = pvVar4->a_type;
    load = (pvVar4->a_un).a_val;
    if (uVar1 == 7) {
      if (2 < *(int *)(local_38->context + 0xa0)) {
        poVar5 = std::operator<<(*(ostream **)(local_38->context + 0x78),"auxv: AT_BASE=");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      local_38->interpBase = load;
    }
    else if (uVar1 == 9) {
      if (2 < *(int *)(local_38->context + 0xa0)) {
        poVar5 = std::operator<<(*(ostream **)(local_38->context + 0x78),"auxv: AT_ENTRY=");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      local_38->entry = load;
    }
    else if (uVar1 == 0x1f) {
      if (2 < *(int *)(local_38->context + 0xa0)) {
        poVar5 = std::operator<<(*(ostream **)(local_38->context + 0x78),"auxv: AT_EXECFN=");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      pPVar3 = local_38;
      peVar2 = (local_38->io).super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (**(code **)(*(long *)peVar2 + 0x38))(local_a0,peVar2,load);
      if (1 < *(int *)(pPVar3->context + 0xa0)) {
        poVar5 = std::operator<<(*(ostream **)(pPVar3->context + 0x78),"filename from auxv: ");
        poVar5 = std::operator<<(poVar5,local_a0);
        std::operator<<(poVar5,"\n");
      }
      pPVar3 = local_38;
      if ((this->execImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        pstack::Context::getImageForName((string *)local_70,SUB81(local_38->context,0));
        std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(this->execImage).
                    super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)local_70);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&elf);
        if (pPVar3->entry == 0) {
          local_38->entry =
               *(Addr *)((local_38->execImage).
                         super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        + 0x90);
        }
      }
      std::__cxx11::string::~string(local_a0);
    }
    else if (uVar1 == 0x20) {
      if (2 < *(int *)(local_38->context + 0xa0)) {
        poVar5 = std::operator<<(*(ostream **)(local_38->context + 0x78),"auxv:AT_SYSINFO=");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      local_38->sysent = load;
    }
    else if (uVar1 == 0x21) {
      __args_1 = local_38->context;
      peVar2 = (local_38->io).super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::string<std::allocator<char>>(local_a0,"(vdso image)",&local_39);
      (**(code **)(*(long *)peVar2 + 0x48))(local_50,peVar2,local_a0,load,0x10000);
      std::make_shared<pstack::Elf::Object,pstack::Context&,std::shared_ptr<pstack::Reader_const>>
                ((Context *)local_70,(shared_ptr<const_pstack::Reader> *)__args_1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
      std::__cxx11::string::~string(local_a0);
      local_38->vdsoBase = load;
      name._M_str = "(vdso image)";
      name._M_len = 0xc;
      addElfObject(local_38,name,(sptr *)local_70,load);
      std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)
                 exeName.field_2._8_8_,
                 (__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)local_70);
      if (1 < *(int *)(local_38->context + 0xa0)) {
        poVar5 = std::operator<<(*(ostream **)(local_38->context + 0x78),"auxv: VDSO ");
        (**(code **)(**(long **)((long)local_70 + 0x40) + 0x28))
                  (*(long **)((long)local_70 + 0x40),poVar5);
        poVar5 = std::operator<<(poVar5," loaded at ");
        *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
             *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
             *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::operator<<(poVar5,"\n");
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&elf);
    }
    else {
      if (uVar1 == 0) {
        return;
      }
      if (2 < *(int *)(local_38->context + 0xa0)) {
        poVar5 = std::operator<<(*(ostream **)(local_38->context + 0x78),"auxv: ");
        pcVar6 = auxtype2str((int)pvVar4->a_type);
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5,": ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
    }
    pp_Var7 = (_func_int **)((long)pp_Var7 + 1);
  } while( true );
}

Assistant:

void
Process::processAUXV(const Reader &auxio)
{
    for (auto &aux : ReaderArray<Elf::auxv_t>(auxio)) {
        Elf::Addr hdr = aux.a_un.a_val;
        switch (aux.a_type) {
            case AT_NULL: // Indicates end of the AUXV vector.
                return;
            case AT_ENTRY: {
                if (context.verbose > 2)
                    *context.debug << "auxv: AT_ENTRY=" << hdr << std::endl;
                // this provides a reference for relocating the executable when
                // compared to the entrypoint there.
                entry = hdr;
                break;
            }
            case AT_SYSINFO: {
                if (context.verbose > 2)
                    *context.debug << "auxv:AT_SYSINFO=" << hdr << std::endl;
                sysent = hdr;
                break;
            }
            case AT_SYSINFO_EHDR: {
                try {
                    auto elf = std::make_shared<Elf::Object>(context, io->view("(vdso image)", hdr, 65536));
                    vdsoBase = hdr;
                    addElfObject("(vdso image)", elf, hdr);
                    vdsoImage = elf;
                    if (context.verbose >= 2) {
                        *context.debug << "auxv: VDSO " << *elf->io
                            << " loaded at " << std::hex << hdr << std::dec << "\n";
                    }

                }
                catch (const std::exception &ex) {
                    if (context.debug)
                        *context.debug << "auxv: warning: failed to load DSO: " << ex.what() << "\n";
                }
                break;
            }
            case AT_BASE:
                if (context.verbose > 2)
                    *context.debug << "auxv: AT_BASE=" << hdr << std::endl;
                interpBase = hdr;
                break;
#ifdef AT_EXECFN
            case AT_EXECFN: {
                if (context.verbose > 2)
                    *context.debug << "auxv: AT_EXECFN=" << hdr << std::endl;
                try {
                    auto exeName = io->readString(hdr);
                    if (context.verbose >= 2)
                        *context.debug << "filename from auxv: " << exeName << "\n";
                    if (!execImage) {
                        execImage = context.getImageForName(exeName);
                        if (entry == 0)
                            entry = execImage->getHeader().e_entry;
                    }
                }
                catch (const Exception &ex) {
                    *context.debug << "failed to read AT_EXECFN: " << ex.what() << std::endl;
                }

                break;
            }
#endif
            default:
                if (context.verbose > 2)
                    *context.debug << "auxv: " << auxtype2str( aux.a_type) << ": " << hdr << std::endl;
        }
    }
}